

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.h
# Opt level: O2

void __thiscall FIX::Session::reset(Session *this)

{
  allocator<char> local_31;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,"",&local_31);
  FIX::Session::generateLogout((string *)this);
  std::__cxx11::string::~string(local_30);
  FIX::Session::disconnect();
  SessionState::reset((SessionState *)(this + 0x250));
  return;
}

Assistant:

void reset() EXCEPT ( IOException )
  { generateLogout(); disconnect(); m_state.reset(); }